

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dePoolArray.hpp
# Opt level: O3

void __thiscall
de::PoolArray<vkt::(anonymous_namespace)::BuildSpirVAsmTask,_8U>::resize
          (PoolArray<vkt::(anonymous_namespace)::BuildSpirVAsmTask,_8U> *this,deUintptr newSize)

{
  undefined8 *puVar1;
  void **ppvVar2;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  void **ppvVar6;
  deUintptr ndx_1;
  deUintptr dVar7;
  ulong uVar8;
  deUintptr ndx;
  ulong uVar9;
  deUintptr val;
  
  dVar7 = this->m_numElements;
  uVar9 = newSize;
  if (newSize < dVar7) {
    do {
      puVar1 = (undefined8 *)
               ((long)this->m_pageTable[uVar9 >> 4] + (ulong)(((uint)uVar9 & 0xf) * 0x30));
      *puVar1 = &PTR_execute_00cec080;
      if ((long *)puVar1[1] != puVar1 + 3) {
        operator_delete((long *)puVar1[1],puVar1[3] + 1);
        dVar7 = this->m_numElements;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < dVar7);
    this->m_numElements = newSize;
  }
  else if (dVar7 < newSize) {
    uVar9 = this->m_capacity;
    if (uVar9 <= newSize) {
      uVar8 = newSize + 0xf >> 4;
      if (this->m_pageTableCapacity < uVar8) {
        uVar5 = this->m_pageTableCapacity * 2;
        if (uVar5 <= uVar8) {
          uVar5 = uVar8;
        }
        ppvVar2 = (void **)deMemPool_alloc(this->m_pool->m_pool,(long)(uVar5 << 0x23) >> 0x20);
        if (ppvVar2 == (void **)0x0) {
LAB_0038526a:
          puVar1 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar1 = time;
          __cxa_throw(puVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        uVar9 = this->m_pageTableCapacity;
        if (uVar9 != 0) {
          uVar4 = 0;
          do {
            ppvVar2[uVar4] = this->m_pageTable[uVar4];
            uVar4 = uVar4 + 1;
          } while (uVar9 != uVar4);
        }
        uVar4 = uVar9 * 8;
        if (uVar9 <= uVar5 && uVar5 - uVar9 != 0) {
          memset(ppvVar2 + uVar9,0,(uVar5 - uVar9) * 8);
        }
        uVar9 = this->m_capacity;
        ppvVar6 = this->m_pageTable;
        this->m_pageTable = ppvVar2;
        this->m_pageTableCapacity = uVar5;
      }
      else {
        uVar4 = 0;
        ppvVar6 = (void **)0x0;
      }
      uVar9 = uVar9 >> 4;
      pvVar3 = (void *)((long)ppvVar6 + 7U & 0xfffffffffffffff8);
      uVar5 = (long)pvVar3 + (0x300 - (long)ppvVar6);
      if (uVar5 <= uVar4) {
        do {
          uVar4 = uVar4 - uVar5;
          this->m_pageTable[uVar9] = pvVar3;
          uVar9 = uVar9 + 1;
          pvVar3 = (void *)((long)pvVar3 + 0x300);
          uVar5 = 0x300;
        } while (0x2ff < uVar4);
      }
      uVar4 = uVar9;
      if (uVar9 < uVar8) {
        do {
          pvVar3 = deMemPool_alignedAlloc(this->m_pool->m_pool,0x300,8);
          if (pvVar3 == (void *)0x0) goto LAB_0038526a;
          this->m_pageTable[uVar9] = pvVar3;
          uVar9 = uVar9 + 1;
          uVar4 = uVar8;
        } while (uVar8 != uVar9);
      }
      this->m_capacity = uVar4 << 4;
    }
    this->m_numElements = newSize;
    do {
      puVar1 = (undefined8 *)
               ((long)this->m_pageTable[dVar7 >> 4] + (ulong)(((uint)dVar7 & 0xf) * 0x30));
      *puVar1 = &PTR_execute_00cec080;
      puVar1[1] = puVar1 + 3;
      puVar1[2] = 0;
      *(undefined1 *)(puVar1 + 3) = 0;
      puVar1[5] = 0;
      dVar7 = dVar7 + 1;
    } while (dVar7 < this->m_numElements);
  }
  return;
}

Assistant:

inline void PoolArray<T, Alignment>::resize (deUintptr newSize)
{
	if (newSize < m_numElements)
	{
		// Destruct elements that are no longer active.
		for (deUintptr ndx = newSize; ndx < m_numElements; ndx++)
			PoolArrayElement<T>::destruct(getPtr(ndx));

		m_numElements = newSize;
	}
	else if (newSize > m_numElements)
	{
		deUintptr prevSize = m_numElements;

		reserve(newSize);
		m_numElements = newSize;

		// Fill new elements with default values
		for (deUintptr ndx = prevSize; ndx < m_numElements; ndx++)
			PoolArrayElement<T>::constructDefault(getPtr(ndx));
	}
}